

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_par_addsub_ge(DisasContext_conflict1 *s,arg_rrr *a,
                      _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_ptr_conflict *gen)

{
  TCGContext_conflict1 *tcg_ctx;
  ulong uVar1;
  TCGv_i32 var;
  TCGv_i32 pTVar2;
  TCGv_ptr ret;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar1 = s->features & 8;
  }
  else {
    uVar1 = s->features >> 0x22 & 1;
  }
  if (uVar1 != 0) {
    var = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    ret = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_i64_aarch64(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,0x21c);
    (*gen)(tcg_ctx,var,var,pTVar2,ret);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    store_reg(s,a->rd,var);
  }
  return uVar1 != 0;
}

Assistant:

static bool op_par_addsub_ge(DisasContext *s, arg_rrr *a,
                             void (*gen)(TCGContext *, TCGv_i32, TCGv_i32,
                                         TCGv_i32, TCGv_ptr))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;
    TCGv_ptr ge;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);

    ge = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, ge, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen(tcg_ctx, t0, t0, t1, ge);

    tcg_temp_free_ptr(tcg_ctx, ge);
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}